

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

bool deqp::gls::FboUtil::checkExtensionSupport
               (ContextInfo *ctxInfo,RenderContext *ctx,string *extension)

{
  RenderContext *this;
  bool bVar1;
  char *name;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *extension_local;
  RenderContext *ctx_local;
  ContextInfo *ctxInfo_local;
  
  local_28 = extension;
  extension_local = (string *)ctx;
  ctx_local = (RenderContext *)ctxInfo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"GL_",&local_49);
  bVar1 = de::beginsWith(extension,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  this = ctx_local;
  if (bVar1) {
    name = (char *)std::__cxx11::string::c_str();
    ctxInfo_local._7_1_ = glu::ContextInfo::isExtensionSupported((ContextInfo *)this,name);
  }
  else {
    bVar1 = std::operator==(local_28,"DEQP_gles3_core_compatible");
    if (bVar1) {
      ctxInfo_local._7_1_ = detectGLESCompatibleContext((RenderContext *)extension_local,3,0);
    }
    else {
      bVar1 = std::operator==(local_28,"DEQP_gles31_core_compatible");
      if (bVar1) {
        ctxInfo_local._7_1_ = detectGLESCompatibleContext((RenderContext *)extension_local,3,1);
      }
      else {
        ctxInfo_local._7_1_ = false;
      }
    }
  }
  return ctxInfo_local._7_1_;
}

Assistant:

static bool checkExtensionSupport (const ContextInfo& ctxInfo, const RenderContext& ctx, const std::string& extension)
{
	if (de::beginsWith(extension, "GL_"))
		return ctxInfo.isExtensionSupported(extension.c_str());
	else if (extension == "DEQP_gles3_core_compatible")
		return detectGLESCompatibleContext(ctx, 3, 0);
	else if (extension == "DEQP_gles31_core_compatible")
		return detectGLESCompatibleContext(ctx, 3, 1);
	else
	{
		DE_ASSERT(false);
		return false;
	}
}